

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-tests.cpp
# Opt level: O1

void __thiscall TestClass2::~TestClass2(TestClass2 *this)

{
  pointer pointer;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  
  if (this->m_DoublePtr != (double *)0x0) {
    operator_delete(this->m_DoublePtr,8);
  }
  pointer = (this->m_Str)._M_dataplus._M_p;
  paVar1 = &(this->m_Str).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pointer != paVar1) {
    operator_delete(pointer,paVar1->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~TestClass2() {
        delete m_DoublePtr;
    }